

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromiseresolver.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseResolver<QByteArray>::
resolve<QtPromisePrivate::PromiseValue<QByteArray>const&>
          (PromiseResolver<QByteArray> *this,PromiseValue<QByteArray> *value)

{
  QPromise<QByteArray> *pQVar1;
  Data *pDVar2;
  PromiseData<QByteArray> *pPVar3;
  QPromise<QByteArray> *promise;
  PromiseValue<QByteArray> *value_local;
  PromiseResolver<QByteArray> *this_local;
  
  pDVar2 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QByteArray>::Data>::
           operator->(&this->m_d);
  pQVar1 = pDVar2->promise;
  if (pQVar1 != (QPromise<QByteArray> *)0x0) {
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QByteArray>_>::operator->
                       (&(pQVar1->super_QPromiseBase<QByteArray>).m_d);
    PromiseData<QByteArray>::resolve<QtPromisePrivate::PromiseValue<QByteArray>const&>(pPVar3,value)
    ;
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QByteArray>_>::operator->
                       (&(pQVar1->super_QPromiseBase<QByteArray>).m_d);
    PromiseDataBase<QByteArray,_void_(const_QByteArray_&)>::dispatch
              (&pPVar3->super_PromiseDataBase<QByteArray,_void_(const_QByteArray_&)>);
    release(this);
  }
  return;
}

Assistant:

void resolve(V&& value)
    {
        auto promise = m_d->promise;
        if (promise) {
            Q_ASSERT(promise->isPending());
            promise->m_d->resolve(std::forward<V>(value));
            promise->m_d->dispatch();
            release();
        }
    }